

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int meatmetal(monst *mtmp)

{
  uint uVar1;
  uint uVar2;
  boolean bVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int mstone;
  int heal;
  int grow;
  int poly;
  permonst *ptr;
  obj *otmp;
  monst *mtmp_local;
  
  if (mtmp->mtame == '\0') {
    for (ptr = (permonst *)level->objects[mtmp->mx][mtmp->my]; ptr != (permonst *)0x0;
        ptr = *(permonst **)&ptr->mlet) {
      if ((((mtmp->data != mons + 0xd9) ||
           ((*(ushort *)&objects[(short)ptr->cnutrit].field_0x11 >> 4 & 0x1f) == 0xb)) &&
          (10 < (*(ushort *)&objects[(short)ptr->cnutrit].field_0x11 >> 4 & 0x1f))) &&
         ((((*(ushort *)&objects[(short)ptr->cnutrit].field_0x11 >> 4 & 0x1f) < 0x12 &&
           (bVar3 = obj_resists((obj *)ptr,5,0x5f), bVar3 == '\0')) &&
          (iVar5 = touch_artifact((obj *)ptr,mtmp), iVar5 != 0)))) {
        if ((mtmp->data == mons + 0xd9) &&
           (uVar1._0_1_ = ptr[1].mmove, uVar1._1_1_ = ptr[1].ac, uVar1._2_1_ = ptr[1].mr,
           uVar1._3_1_ = ptr[1].maligntyp, (uVar1 >> 0xc & 1) != 0)) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0024675f;
            if (((((u.uprops[0x1e].intrinsic == 0) &&
                  ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               (((u.uprops[0x40].intrinsic != 0 ||
                 ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                ((mtmp->data->mflags3 & 0x200) != 0)))) {
              bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
              goto joined_r0x00246759;
            }
          }
          else {
            bVar4 = worm_known(level,mtmp);
joined_r0x00246759:
            if (bVar4 != 0) {
LAB_0024675f:
              if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0))
                   || (u.uprops[0xc].extrinsic != 0)) ||
                  (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                 ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
                   ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) &&
                  ((((byte)u._1052_1_ >> 5 & 1) == 0 && (flags.verbose != '\0')))))) {
                pcVar6 = Monnam(mtmp);
                pcVar7 = distant_name((obj *)ptr,doname);
                pline("%s eats %s!",pcVar6,pcVar7);
              }
            }
          }
          uVar8._0_1_ = ptr[1].mmove;
          uVar8._1_1_ = ptr[1].ac;
          uVar8._2_1_ = ptr[1].mr;
          uVar8._3_1_ = ptr[1].maligntyp;
          uVar8 = uVar8 & 0xffffefff;
          ptr[1].mmove = (char)uVar8;
          ptr[1].ac = (char)(uVar8 >> 8);
          ptr[1].mr = (char)(uVar8 >> 0x10);
          ptr[1].maligntyp = (char)(uVar8 >> 0x18);
          *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffefffff | 0x100000;
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if (((((u.uprops[0x1e].intrinsic != 0) ||
                    ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                   (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                  ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                 (((u.uprops[0x40].intrinsic == 0 &&
                   ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0))))
                  || ((mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_002470ea;
              bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
              goto joined_r0x002469ad;
            }
          }
          else {
            bVar4 = worm_known(level,mtmp);
joined_r0x002469ad:
            if (bVar4 == 0) goto LAB_002470ea;
          }
          if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
             ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
               ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) &&
              ((((byte)u._1052_1_ >> 5 & 1) == 0 && (flags.verbose != '\0')))))) {
            pcVar6 = Monnam(mtmp);
            pcVar7 = distant_name((obj *)ptr,doname);
            pline("%s spits %s out in disgust!",pcVar6,pcVar7);
          }
        }
        else if ((ptr->cnutrit != 0xcb) && (ptr->cnutrit != 0xb4)) {
          if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) || (flags.verbose == '\0')) {
            if ((flags.soundok != '\0') && (flags.verbose != '\0')) {
              You_hear("a crunching sound.");
            }
          }
          else {
            pcVar6 = Monnam(mtmp);
            pcVar7 = distant_name((obj *)ptr,doname);
            pline("%s eats %s!",pcVar6,pcVar7);
          }
          uVar2._0_2_ = ptr->pxtyp;
          uVar2._2_1_ = ptr->msound;
          uVar2._3_1_ = ptr->msize;
          mtmp->meating = (uVar2 >> 1) + 1;
          if ((mtmp->mhp < mtmp->mhpmax) &&
             (mtmp->mhp = (uint)objects[(short)ptr->cnutrit].oc_weight + mtmp->mhp,
             mtmp->mhpmax < mtmp->mhp)) {
            mtmp->mhp = mtmp->mhpmax;
          }
          if ((obj *)ptr == uball) {
            unpunish();
            delobj((obj *)ptr);
            goto LAB_0024708a;
          }
          if ((obj *)ptr == uchain) {
            unpunish();
            goto LAB_0024708a;
          }
          if (((ptr->cnutrit == 0x10e) || (ptr->cnutrit == 0x10f)) ||
             (bVar9 = false, ptr->cnutrit == 0x129)) {
            iVar5 = pm_to_cham((int)ptr[1].mattk[0]);
            bVar9 = iVar5 != 0;
          }
          if (((ptr->cnutrit == 0x10e) || (ptr->cnutrit == 0x10f)) ||
             (bVar10 = false, ptr->cnutrit == 0x129)) {
            bVar10 = ptr[1].mattk[0] == (attack)0xec;
          }
          if (((ptr->cnutrit == 0x10e) || (ptr->cnutrit == 0x10f)) ||
             (bVar11 = false, ptr->cnutrit == 0x129)) {
            bVar11 = ptr[1].mattk[0] == (attack)0x119;
          }
          if ((((ptr->cnutrit == 0x10e) || (ptr->cnutrit == 0x10f)) ||
              (bVar12 = false, ptr->cnutrit == 0x129)) &&
             ((bVar12 = true, ((long)(int)ptr[1].mattk[0] & 0x3ffffffffffffffU) != 0xc &&
              (bVar12 = true, ((long)(int)ptr[1].mattk[0] & 0x3ffffffffffffffU) != 0xb)))) {
            bVar12 = ptr[1].mattk[0] == (attack)0x127;
          }
          delobj((obj *)ptr);
          _grow = mtmp->data;
          if (bVar9) {
            iVar5 = newcham(level,mtmp,(permonst *)0x0,'\0','\0');
            if (iVar5 != 0) {
              _grow = mtmp->data;
            }
          }
          else if (bVar10) {
            _grow = grow_up(mtmp,(monst *)0x0);
          }
          else if (bVar12) {
            bVar3 = poly_when_stoned(_grow);
            if (bVar3 == '\0') {
              if ((mtmp->mintrinsics & 0x80) == 0) {
                if (mtmp->wormno == '\0') {
                  if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00246fa4;
                  if (((((u.uprops[0x1e].intrinsic == 0) &&
                        ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                     (((u.uprops[0x40].intrinsic != 0 ||
                       ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))
                       )) && ((mtmp->data->mflags3 & 0x200) != 0)))) {
                    bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
                    goto joined_r0x00246f9e;
                  }
                }
                else {
                  bVar4 = worm_known(level,mtmp);
joined_r0x00246f9e:
                  if (bVar4 != 0) {
LAB_00246fa4:
                    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) ||
                          (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                        (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                       ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
                         ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) &&
                        (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
                      pcVar6 = Monnam(mtmp);
                      pline("%s turns to stone!",pcVar6);
                    }
                  }
                }
                monstone(mtmp);
                _grow = (permonst *)0x0;
              }
            }
            else {
              mon_to_stone(mtmp);
              _grow = mtmp->data;
            }
          }
          else if (bVar11) {
            mtmp->mhp = mtmp->mhpmax;
          }
          if (_grow == (permonst *)0x0) {
            return 2;
          }
LAB_0024708a:
          iVar5 = rnd(0x19);
          if (iVar5 < 3) {
            mksobj_at(0x213,level,(int)mtmp->mx,(int)mtmp->my,'\x01','\0');
          }
          newsym((int)mtmp->mx,(int)mtmp->my);
          return 1;
        }
      }
LAB_002470ea:
    }
  }
  return 0;
}

Assistant:

int meatmetal(struct monst *mtmp)
{
	struct obj *otmp;
	const struct permonst *ptr;
	int poly, grow, heal, mstone;

	/* If a pet, eating is handled separately, in dog.c */
	if (mtmp->mtame) return 0;

	/* Eats topmost metal object if it is there */
	for (otmp = level->objects[mtmp->mx][mtmp->my];
						otmp; otmp = otmp->nexthere) {
	    if (mtmp->data == &mons[PM_RUST_MONSTER] && !is_rustprone(otmp))
		continue;
	    if (is_metallic(otmp) && !obj_resists(otmp, 5, 95) &&
		touch_artifact(otmp,mtmp)) {
		if (mtmp->data == &mons[PM_RUST_MONSTER] && otmp->oerodeproof) {
		    if (canseemon(level, mtmp) && flags.verbose) {
			pline("%s eats %s!",
				Monnam(mtmp),
				distant_name(otmp,doname));
		    }
		    /* The object's rustproofing is gone now */
		    otmp->oerodeproof = 0;
		    mtmp->mstun = 1;
		    if (canseemon(level, mtmp) && flags.verbose) {
			pline("%s spits %s out in disgust!",
			      Monnam(mtmp), distant_name(otmp,doname));
		    }
		/* KMH -- Don't eat indigestible/choking objects */
		} else if (otmp->otyp != AMULET_OF_STRANGULATION &&
				otmp->otyp != RIN_SLOW_DIGESTION) {
		    if (cansee(mtmp->mx,mtmp->my) && flags.verbose)
			pline("%s eats %s!", Monnam(mtmp),
				distant_name(otmp,doname));
		    else if (flags.soundok && flags.verbose)
			You_hear("a crunching sound.");
		    mtmp->meating = otmp->owt/2 + 1;
		    /* Heal up to the object's weight in hp */
		    if (mtmp->mhp < mtmp->mhpmax) {
			mtmp->mhp += objects[otmp->otyp].oc_weight;
			if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;
		    }
		    if (otmp == uball) {
			unpunish();
			delobj(otmp);
		    } else if (otmp == uchain) {
			unpunish();	/* frees uchain */
		    } else {
			poly = polyfodder(otmp);
			grow = mlevelgain(otmp);
			heal = mhealup(otmp);
			mstone = mstoning(otmp);
			delobj(otmp);
			ptr = mtmp->data;
			if (poly) {
			    if (newcham(level, mtmp, NULL,
					FALSE, FALSE))
				ptr = mtmp->data;
			} else if (grow) {
			    ptr = grow_up(mtmp, NULL);
			} else if (mstone) {
			    if (poly_when_stoned(ptr)) {
				mon_to_stone(mtmp);
				ptr = mtmp->data;
			    } else if (!resists_ston(mtmp)) {
				if (canseemon(level, mtmp))
				    pline("%s turns to stone!", Monnam(mtmp));
				monstone(mtmp);
				ptr = NULL;
			    }
			} else if (heal) {
			    mtmp->mhp = mtmp->mhpmax;
			}
			if (!ptr) return 2;		 /* it died */
		    }
		    /* Left behind a pile? */
		    if (rnd(25) < 3)
			mksobj_at(ROCK, level, mtmp->mx, mtmp->my, TRUE, FALSE);
		    newsym(mtmp->mx, mtmp->my);
		    return 1;
		}
	    }
	}
	return 0;
}